

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_aux.c
# Opt level: O1

void adjuststack(luaL_Buffer *B)

{
  lua_State *L;
  bool bVar1;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  uint n;
  
  if (1 < B->lvl) {
    L = B->L;
    sVar3 = lua_objlen(L,-1);
    n = 1;
    do {
      sVar4 = lua_objlen(L,~n);
      bVar2 = 8 < (int)(B->lvl - n);
      bVar1 = sVar4 < sVar3;
      if (!bVar1 && !bVar2) {
        sVar4 = 0;
      }
      n = n + (bVar1 || bVar2);
    } while ((bVar1 || bVar2) && (sVar3 = sVar3 + sVar4, (int)n < B->lvl));
    lua_concat(L,n);
    B->lvl = (B->lvl - n) + 1;
  }
  return;
}

Assistant:

static void adjuststack(luaL_Buffer *B)
{
  if (B->lvl > 1) {
    lua_State *L = B->L;
    int toget = 1;  /* number of levels to concat */
    size_t toplen = lua_strlen(L, -1);
    do {
      size_t l = lua_strlen(L, -(toget+1));
      if (!(B->lvl - toget + 1 >= LUA_MINSTACK/2 || toplen > l))
	break;
      toplen += l;
      toget++;
    } while (toget < B->lvl);
    lua_concat(L, toget);
    B->lvl = B->lvl - toget + 1;
  }
}